

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONBuildPresets.cxx
# Opt level: O1

ReadFileResult
cmCMakePresetsGraphInternal::BuildPresetsHelper
          (vector<cmCMakePresetsGraph::BuildPreset,_std::allocator<cmCMakePresetsGraph::BuildPreset>_>
           *out,Value *value)

{
  ReadFileResult RVar1;
  int iVar2;
  Object<cmCMakePresetsGraph::BuildPreset> *in_R8;
  Value *local_40;
  vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member>_>
  local_38;
  undefined5 uStack_20;
  undefined3 local_1b;
  undefined5 uStack_18;
  
  if (BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
      ::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                                 ::helper);
    if (iVar2 != 0) {
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member>_>
      ::vector(&local_38,
               (vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member>_>
                *)(anonymous_namespace)::BuildPresetHelper);
      uStack_18 = (anonymous_namespace)::BuildPresetHelper._32_5_;
      uStack_20 = (anonymous_namespace)::BuildPresetHelper._24_5_;
      local_1b = (anonymous_namespace)::BuildPresetHelper._29_3_;
      cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
      Vector<cmCMakePresetsGraph::BuildPreset,cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>>
                (&BuildPresetsHelper::helper,
                 (cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult> *)0x0,INVALID_PRESETS,
                 (ReadFileResult)&local_38,in_R8);
      std::
      vector<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member,_std::allocator<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraph::BuildPreset>::Member>_>
      ::~vector(&local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,&BuildPresetsHelper::helper,&__dso_handle);
      __cxa_guard_release(&BuildPresetsHelper(std::vector<cmCMakePresetsGraph::BuildPreset,std::allocator<cmCMakePresetsGraph::BuildPreset>>&,Json::Value_const*)
                           ::helper);
    }
  }
  local_40 = value;
  if (BuildPresetsHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    RVar1 = (*BuildPresetsHelper::helper._M_invoker)
                      ((_Any_data *)&BuildPresetsHelper::helper,out,&local_40);
    return RVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

ReadFileResult BuildPresetsHelper(std::vector<BuildPreset>& out,
                                  const Json::Value* value)
{
  static auto const helper = JSONHelperBuilder::Vector<BuildPreset>(
    ReadFileResult::READ_OK, ReadFileResult::INVALID_PRESETS,
    BuildPresetHelper);

  return helper(out, value);
}